

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::IsValid(ON_Xform *this)

{
  ulong uVar1;
  ulong uVar2;
  double *x;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (0x7f < uVar2) break;
    uVar1 = uVar2 + 8;
  } while (ABS(*(double *)((long)this->m_xform[0] + uVar2)) < 1.23432101234321e+308);
  return 0x7f < uVar2;
}

Assistant:

bool ON_Xform::IsValid() const
{
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  while ( x < x16 )
  {
    const double t = *x++;
    if (ON_IS_VALID(t))
      continue;
    return false; // t is not valid
  }
  return true;
}